

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O1

Formula * __thiscall
COLLADASaxFWL::DocumentProcessor::getFormulaByUniqueId(DocumentProcessor *this,UniqueId *uniqueId)

{
  iterator iVar1;
  Formula *pFVar2;
  
  iVar1 = std::
          _Rb_tree<COLLADAFW::UniqueId,_std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>,_std::_Select1st<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>,_std::less<COLLADAFW::UniqueId>,_std::allocator<std::pair<const_COLLADAFW::UniqueId,_COLLADAFW::Formula_*>_>_>
          ::find(&this->mFormulasMap->_M_t,uniqueId);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mFormulasMap->_M_t)._M_impl.super__Rb_tree_header)
  {
    pFVar2 = (Formula *)0x0;
  }
  else {
    pFVar2 = (Formula *)iVar1._M_node[1]._M_right;
  }
  return pFVar2;
}

Assistant:

COLLADAFW::Formula* DocumentProcessor::getFormulaByUniqueId( const COLLADAFW::UniqueId& uniqueId ) const
	{
		COLLADAFW::Formula* formula = 0;
		Loader::UniqueIdFormulaMap::const_iterator it = mFormulasMap.find(uniqueId);
		if ( it != mFormulasMap.end() )
		{
			formula = it->second;
		}
		return formula;
	}